

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testgest.cpp
# Opt level: O2

void Gesture1_Do_proc(Am_Object *cmd)

{
  char cVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  double dVar4;
  Am_Object inter;
  Am_Value v;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)cmd);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_Value::operator=(&v,pAVar2);
  cVar1 = Am_Value::Valid();
  if (cVar1 == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cout,"** UNRECOGNIZED");
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"** Recognized: ");
    poVar3 = (ostream *)operator<<(poVar3,&v);
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"(nap = ");
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&inter,0x141);
  dVar4 = Am_Value::operator_cast_to_double(pAVar2);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar3,", dist=");
  pAVar2 = (Am_Value *)Am_Object::Get((ushort)&inter,0x142);
  dVar4 = Am_Value::operator_cast_to_double(pAVar2);
  poVar3 = std::ostream::_M_insert<double>(dVar4);
  poVar3 = std::operator<<(poVar3,")");
  std::endl<char,std::char_traits<char>>(poVar3);
  Am_Value::~Am_Value(&v);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Gesture1_Do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value v;

  v = cmd.Peek(Am_VALUE);
  if (v.Valid())
    cout << "** Recognized: " << v << endl;
  else
    cout << "** UNRECOGNIZED" << endl;

  cout << "(nap = " << (double)inter.Get(Am_NONAMBIGUITY_PROB)
       << ", dist=" << (double)inter.Get(Am_DIST_TO_MEAN) << ")" << endl;
}